

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this,
          shared_ptr<nuraft::buffer> *result,cmd_result_code code)

{
  undefined4 in_EDX;
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  *in_RDI;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<nuraft::buffer>::shared_ptr((shared_ptr<nuraft::buffer> *)0x1d8571);
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<std::exception>::shared_ptr((shared_ptr<std::exception> *)0x1d8592);
  *(undefined4 *)&in_RDI[1].super__Function_base._M_manager = in_EDX;
  *(undefined1 *)((long)&in_RDI[1].super__Function_base._M_manager + 4) = 1;
  *(undefined1 *)((long)&in_RDI[1].super__Function_base._M_manager + 5) = 0;
  std::function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)> *)
           in_RDI,in_stack_ffffffffffffffd8);
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::function(in_RDI,in_stack_ffffffffffffffd8);
  std::mutex::mutex((mutex *)0x1d85d3);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 5));
  return;
}

Assistant:

explicit cmd_result(T& result,
                        cmd_result_code code = cmd_result_code::OK)
        : result_(result)
        , err_()
        , code_(code)
        , has_result_(true)
        , accepted_(false)
        , handler_(nullptr)
        , handler2_(nullptr)
        {}